

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parameter.cpp
# Opt level: O2

void __thiscall
chains::ProcessorHost<boost::hana::tuple<AddModule::Processor,_MultiplyModule::Processor>_>::
setParameter(ProcessorHost<boost::hana::tuple<AddModule::Processor,_MultiplyModule::Processor>_>
             *this,int processorId,int parameterIndex,double value)

{
  int local_10;
  int local_c;
  double local_8;
  
  local_10 = processorId;
  local_c = parameterIndex;
  local_8 = value;
  boost::hana::any_of_impl<boost::hana::tuple_tag,boost::hana::when<true>>::any_of_helper<0ul,2ul>::
  apply<boost::hana::tuple<AddModule::Processor,MultiplyModule::Processor>&,chains::ProcessorHost<boost::hana::tuple<AddModule::Processor,MultiplyModule::Processor>>::setParameter(int,int,double)::_lambda(auto:1&)_1_>
            (this,&local_10);
  return;
}

Assistant:

void setParameter(const int processorId, const int parameterIndex, const double value)
  {
    hana::any_of(processors_,
      [=] (auto& processor) {
        if (processor.id() == processorId) {
          processor.parameter(parameterIndex).setValue(value);
          return true;
        }
        return false;
      });
  }